

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.cpp
# Opt level: O0

void __thiscall QDebugStateSaverPrivate::restoreState(QDebugStateSaverPrivate *this)

{
  long lVar1;
  undefined4 uVar2;
  byte bVar3;
  bool bVar4;
  pointer pQVar5;
  QString *in_RDI;
  long in_FS_OFFSET;
  bool currentSpaces;
  qsizetype in_stack_ffffffffffffffc8;
  QString *this_00;
  QString *pQVar6;
  char c;
  QTextStream *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = *(byte *)&(in_RDI->d).d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i &
          1;
  pQVar6 = in_RDI;
  if ((bVar3 != 0) && (((ulong)(in_RDI->d).ptr & 1) == 0)) {
    this_00 = (QString *)((in_RDI->d).d + 1);
    QChar::QChar<char16_t,_true>((QChar *)&stack0xfffffffffffffff6,L' ');
    bVar4 = QString::endsWith(in_RDI,(QChar)(char16_t)((ulong)pQVar6 >> 0x30),
                              (CaseSensitivity)((ulong)this_00 >> 0x20));
    if (bVar4) {
      QString::chop(this_00,in_stack_ffffffffffffffc8);
    }
  }
  c = (char)((ulong)pQVar6 >> 0x38);
  *(byte *)&(in_RDI->d).d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i =
       *(byte *)&(in_RDI->d).ptr & 1;
  *(byte *)((long)&(in_RDI->d).d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i + 1
           ) = *(byte *)((long)&(in_RDI->d).ptr + 1) & 1;
  pQVar5 = std::unique_ptr<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>::operator->
                     ((unique_ptr<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_> *)
                      0x27ad7e);
  uVar2 = *(undefined4 *)((long)&(in_RDI->d).size + 4);
  (pQVar5->params).realNumberPrecision = *(undefined4 *)&(in_RDI->d).size;
  (pQVar5->params).integerBase = uVar2;
  *(Data **)&(pQVar5->params).fieldWidth = in_RDI[1].d.d;
  *(char16_t **)&(pQVar5->params).fieldAlignment = in_RDI[1].d.ptr;
  (pQVar5->params).numberFlags.super_QFlagsStorageHelper<QTextStream::NumberFlag,_4>.
  super_QFlagsStorage<QTextStream::NumberFlag>.i = (Int)in_RDI[1].d.size;
  (in_RDI->d).d[3].super_QArrayData.flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
  super_QFlagsStorage<QArrayData::ArrayOption>.i = *(Int *)((long)&(in_RDI->d).ptr + 4);
  if ((bVar3 == 0) && (((ulong)(in_RDI->d).ptr & 1) != 0)) {
    QTextStream::operator<<(in_stack_fffffffffffffff0,c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void restoreState()
    {
        const bool currentSpaces = m_stream->space;
        if (currentSpaces && !m_spaces)
            if (m_stream->buffer.endsWith(u' '))
                m_stream->buffer.chop(1);

        m_stream->space = m_spaces;
        m_stream->noQuotes = m_noQuotes;
        m_stream->ts.d_ptr->params = m_streamParams;
        m_stream->verbosity = m_verbosity;

        if (!currentSpaces && m_spaces)
            m_stream->ts << ' ';
    }